

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer_options.cpp
# Opt level: O2

void __thiscall
RandomizerOptions::RandomizerOptions
          (RandomizerOptions *this,ArgumentDictionary *args,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
          *item_names,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *spawn_location_names)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  uint32_t uVar3;
  size_type sVar4;
  ostream *poVar5;
  LandstalkerException *this_00;
  string *this_01;
  allocator<char> local_2f1;
  string preset_path;
  Json preset_json;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string permalink_string;
  string local_258;
  ifstream preset_file;
  byte abStack_218 [488];
  
  p_Var1 = &(this->_item_names)._M_t._M_impl.super__Rb_tree_header;
  (this->_item_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_item_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_item_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_item_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_item_names)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_spawn_location_names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_spawn_location_names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_spawn_location_names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_goal = '\0';
  this->_jewel_count = '\x02';
  this->_use_armor_upgrades = true;
  this->_starting_life = '\0';
  this->_starting_gold = 0;
  (this->_starting_items)._M_elems[0] = '\0';
  (this->_starting_items)._M_elems[1] = '\0';
  (this->_starting_items)._M_elems[2] = '\0';
  (this->_starting_items)._M_elems[3] = '\0';
  (this->_starting_items)._M_elems[4] = '\0';
  (this->_starting_items)._M_elems[5] = '\0';
  (this->_starting_items)._M_elems[6] = '\0';
  (this->_starting_items)._M_elems[7] = '\0';
  (this->_starting_items)._M_elems[8] = '\0';
  (this->_starting_items)._M_elems[9] = '\0';
  (this->_starting_items)._M_elems[10] = '\0';
  (this->_starting_items)._M_elems[0xb] = '\0';
  (this->_starting_items)._M_elems[0xc] = '\0';
  (this->_starting_items)._M_elems[0xd] = '\0';
  (this->_starting_items)._M_elems[0xe] = '\0';
  (this->_starting_items)._M_elems[0xf] = '\0';
  (this->_starting_items)._M_elems[0x10] = '\0';
  (this->_starting_items)._M_elems[0x11] = '\0';
  (this->_starting_items)._M_elems[0x12] = '\0';
  (this->_starting_items)._M_elems[0x13] = '\0';
  (this->_starting_items)._M_elems[0x14] = '\0';
  (this->_starting_items)._M_elems[0x15] = '\0';
  (this->_starting_items)._M_elems[0x16] = '\0';
  (this->_starting_items)._M_elems[0x17] = '\0';
  (this->_starting_items)._M_elems[0x18] = '\0';
  (this->_starting_items)._M_elems[0x19] = '\0';
  (this->_starting_items)._M_elems[0x1a] = '\0';
  (this->_starting_items)._M_elems[0x1b] = '\0';
  (this->_starting_items)._M_elems[0x1c] = '\0';
  (this->_starting_items)._M_elems[0x1d] = '\0';
  (this->_starting_items)._M_elems[0x1e] = '\0';
  (this->_starting_items)._M_elems[0x1f] = '\0';
  (this->_starting_items)._M_elems[0x20] = '\0';
  (this->_starting_items)._M_elems[0x21] = '\0';
  (this->_starting_items)._M_elems[0x22] = '\0';
  (this->_starting_items)._M_elems[0x23] = '\0';
  (this->_starting_items)._M_elems[0x24] = '\0';
  (this->_starting_items)._M_elems[0x25] = '\0';
  (this->_starting_items)._M_elems[0x26] = '\0';
  (this->_starting_items)._M_elems[0x27] = '\0';
  (this->_starting_items)._M_elems[0x28] = '\0';
  (this->_starting_items)._M_elems[0x29] = '\0';
  (this->_starting_items)._M_elems[0x2a] = '\0';
  (this->_starting_items)._M_elems[0x2b] = '\0';
  (this->_starting_items)._M_elems[0x2c] = '\0';
  (this->_starting_items)._M_elems[0x2d] = '\0';
  (this->_starting_items)._M_elems[0x2e] = '\0';
  (this->_starting_items)._M_elems[0x2f] = '\0';
  (this->_starting_items)._M_elems[0x30] = '\0';
  (this->_starting_items)._M_elems[0x31] = '\0';
  (this->_starting_items)._M_elems[0x32] = '\0';
  (this->_starting_items)._M_elems[0x33] = '\0';
  (this->_starting_items)._M_elems[0x34] = '\0';
  (this->_starting_items)._M_elems[0x35] = '\0';
  (this->_starting_items)._M_elems[0x36] = '\0';
  (this->_starting_items)._M_elems[0x37] = '\0';
  (this->_starting_items)._M_elems[0x38] = '\0';
  (this->_starting_items)._M_elems[0x39] = '\0';
  (this->_starting_items)._M_elems[0x3a] = '\0';
  (this->_starting_items)._M_elems[0x3b] = '\0';
  (this->_starting_items)._M_elems[0x3c] = '\0';
  (this->_starting_items)._M_elems[0x3d] = '\0';
  this->_fix_armlet_skip = true;
  this->_remove_tree_cutting_glitch_drops = true;
  this->_consumable_record_book = false;
  this->_consumable_spell_book = false;
  this->_remove_gumi_boulder = false;
  this->_remove_tibor_requirement = false;
  this->_all_trees_visited_at_start = false;
  this->_ekeeke_auto_revive = true;
  this->_enemies_damage_factor = 100;
  this->_enemies_health_factor = 100;
  this->_enemies_armor_factor = 100;
  this->_enemies_golds_factor = 100;
  this->_enemies_drop_chance_factor = 100;
  this->_health_gained_per_lifestock = '\x01';
  this->_fast_transitions = true;
  this->_archipelago_world = false;
  (this->_finite_shop_items).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_finite_shop_items).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_finite_ground_items).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_finite_shop_items).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_finite_ground_items).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_finite_ground_items).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->_seed = 0;
  this->_allow_spoiler_log = true;
  (this->_possible_spawn_locations).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->_possible_spawn_locations).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->_possible_spawn_locations).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->_possible_spawn_locations).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  this->_shop_prices_factor = 100;
  this->_enemy_jumping_in_logic = false;
  this->_damage_boosting_in_logic = false;
  this->_tree_cutting_glitch_in_logic = false;
  this->_allow_whistle_usage_behind_trees = false;
  this->_ensure_ekeeke_in_shops = true;
  (this->_items_distribution)._M_elems[0] = '\0';
  (this->_items_distribution)._M_elems[1] = '\0';
  (this->_items_distribution)._M_elems[2] = '\0';
  (this->_items_distribution)._M_elems[3] = '\0';
  (this->_items_distribution)._M_elems[4] = '\0';
  (this->_items_distribution)._M_elems[5] = '\0';
  (this->_items_distribution)._M_elems[6] = '\0';
  (this->_items_distribution)._M_elems[7] = '\0';
  (this->_items_distribution)._M_elems[8] = '\0';
  (this->_items_distribution)._M_elems[9] = '\0';
  (this->_items_distribution)._M_elems[10] = '\0';
  (this->_items_distribution)._M_elems[0xb] = '\0';
  (this->_items_distribution)._M_elems[0xc] = '\0';
  (this->_items_distribution)._M_elems[0xd] = '\0';
  (this->_items_distribution)._M_elems[0xe] = '\0';
  (this->_items_distribution)._M_elems[0xf] = '\0';
  (this->_items_distribution)._M_elems[0x10] = '\0';
  (this->_items_distribution)._M_elems[0x11] = '\0';
  (this->_items_distribution)._M_elems[0x12] = '\0';
  (this->_items_distribution)._M_elems[0x13] = '\0';
  (this->_items_distribution)._M_elems[0x14] = '\0';
  (this->_items_distribution)._M_elems[0x15] = '\0';
  (this->_items_distribution)._M_elems[0x16] = '\0';
  (this->_items_distribution)._M_elems[0x17] = '\0';
  (this->_items_distribution)._M_elems[0x18] = '\0';
  (this->_items_distribution)._M_elems[0x19] = '\0';
  (this->_items_distribution)._M_elems[0x1a] = '\0';
  (this->_items_distribution)._M_elems[0x1b] = '\0';
  (this->_items_distribution)._M_elems[0x1c] = '\0';
  (this->_items_distribution)._M_elems[0x1d] = '\0';
  (this->_items_distribution)._M_elems[0x1e] = '\0';
  (this->_items_distribution)._M_elems[0x1f] = '\0';
  (this->_items_distribution)._M_elems[0x20] = '\0';
  (this->_items_distribution)._M_elems[0x21] = '\0';
  (this->_items_distribution)._M_elems[0x22] = '\0';
  (this->_items_distribution)._M_elems[0x23] = '\0';
  (this->_items_distribution)._M_elems[0x24] = '\0';
  (this->_items_distribution)._M_elems[0x25] = '\0';
  (this->_items_distribution)._M_elems[0x26] = '\0';
  (this->_items_distribution)._M_elems[0x27] = '\0';
  (this->_items_distribution)._M_elems[0x28] = '\0';
  (this->_items_distribution)._M_elems[0x29] = '\0';
  (this->_items_distribution)._M_elems[0x2a] = '\0';
  (this->_items_distribution)._M_elems[0x2b] = '\0';
  (this->_items_distribution)._M_elems[0x2c] = '\0';
  (this->_items_distribution)._M_elems[0x2d] = '\0';
  (this->_items_distribution)._M_elems[0x2e] = '\0';
  (this->_items_distribution)._M_elems[0x2f] = '\0';
  (this->_items_distribution)._M_elems[0x30] = '\0';
  (this->_items_distribution)._M_elems[0x31] = '\0';
  (this->_items_distribution)._M_elems[0x32] = '\0';
  (this->_items_distribution)._M_elems[0x33] = '\0';
  (this->_items_distribution)._M_elems[0x34] = '\0';
  (this->_items_distribution)._M_elems[0x35] = '\0';
  (this->_items_distribution)._M_elems[0x36] = '\0';
  (this->_items_distribution)._M_elems[0x37] = '\0';
  (this->_items_distribution)._M_elems[0x38] = '\0';
  (this->_items_distribution)._M_elems[0x39] = '\0';
  (this->_items_distribution)._M_elems[0x3a] = '\0';
  (this->_items_distribution)._M_elems[0x3b] = '\0';
  (this->_items_distribution)._M_elems[0x3c] = '\0';
  (this->_items_distribution)._M_elems[0x3d] = '\0';
  (this->_items_distribution)._M_elems[0x3e] = '\0';
  (this->_items_distribution)._M_elems[0x3f] = '\0';
  (this->_items_distribution)._M_elems[0x3d] = '\0';
  (this->_items_distribution)._M_elems[0x3e] = '\0';
  (this->_items_distribution)._M_elems[0x3f] = '\0';
  (this->_items_distribution)._M_elems[0x40] = '\0';
  (this->_items_distribution)._M_elems[0x41] = '\0';
  (this->_items_distribution)._M_elems[0x42] = '\0';
  (this->_items_distribution)._M_elems[0x43] = '\0';
  (this->_items_distribution)._M_elems[0x44] = '\0';
  this->_filler_item = '\0';
  this->_hints_distribution_region_requirement = '\0';
  this->_hints_distribution_item_requirement = '\0';
  this->_hints_distribution_item_location = '\0';
  this->_hints_distribution_dark_region = '\0';
  this->_hints_distribution_joke = '\0';
  this->_christmas_event = false;
  this->_secret_event = false;
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&this->_world_json,(nullptr_t)0x0);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&this->_model_patch_items,(nullptr_t)0x0);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&this->_model_patch_spawns,(nullptr_t)0x0);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&this->_model_patch_hint_sources,(nullptr_t)0x0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
               *)this,&item_names->_M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->_spawn_location_names,spawn_location_names);
  (this->_starting_items)._M_elems[0x2e] = '\0';
  (this->_starting_items)._M_elems[0x2f] = '\0';
  (this->_starting_items)._M_elems[0x30] = '\0';
  (this->_starting_items)._M_elems[0x31] = '\0';
  (this->_starting_items)._M_elems[0x32] = '\0';
  (this->_starting_items)._M_elems[0x33] = '\0';
  (this->_starting_items)._M_elems[0x34] = '\0';
  (this->_starting_items)._M_elems[0x35] = '\0';
  (this->_starting_items)._M_elems[0x36] = '\0';
  (this->_starting_items)._M_elems[0x37] = '\0';
  (this->_starting_items)._M_elems[0x38] = '\0';
  (this->_starting_items)._M_elems[0x39] = '\0';
  (this->_starting_items)._M_elems[0x3a] = '\0';
  (this->_starting_items)._M_elems[0x3b] = '\0';
  (this->_starting_items)._M_elems[0x3c] = '\0';
  (this->_starting_items)._M_elems[0x3d] = '\0';
  (this->_starting_items)._M_elems[0x20] = '\0';
  (this->_starting_items)._M_elems[0x21] = '\0';
  (this->_starting_items)._M_elems[0x22] = '\0';
  (this->_starting_items)._M_elems[0x23] = '\0';
  (this->_starting_items)._M_elems[0x24] = '\0';
  (this->_starting_items)._M_elems[0x25] = '\0';
  (this->_starting_items)._M_elems[0x26] = '\0';
  (this->_starting_items)._M_elems[0x27] = '\0';
  (this->_starting_items)._M_elems[0x28] = '\0';
  (this->_starting_items)._M_elems[0x29] = '\0';
  (this->_starting_items)._M_elems[0x2a] = '\0';
  (this->_starting_items)._M_elems[0x2b] = '\0';
  (this->_starting_items)._M_elems[0x2c] = '\0';
  (this->_starting_items)._M_elems[0x2d] = '\0';
  (this->_starting_items)._M_elems[0x2e] = '\0';
  (this->_starting_items)._M_elems[0x2f] = '\0';
  (this->_starting_items)._M_elems[0x10] = '\0';
  (this->_starting_items)._M_elems[0x11] = '\0';
  (this->_starting_items)._M_elems[0x12] = '\0';
  (this->_starting_items)._M_elems[0x13] = '\0';
  (this->_starting_items)._M_elems[0x14] = '\0';
  (this->_starting_items)._M_elems[0x15] = '\0';
  (this->_starting_items)._M_elems[0x16] = '\0';
  (this->_starting_items)._M_elems[0x17] = '\0';
  (this->_starting_items)._M_elems[0x18] = '\0';
  (this->_starting_items)._M_elems[0x19] = '\0';
  (this->_starting_items)._M_elems[0x1a] = '\0';
  (this->_starting_items)._M_elems[0x1b] = '\0';
  (this->_starting_items)._M_elems[0x1c] = '\0';
  (this->_starting_items)._M_elems[0x1d] = '\0';
  (this->_starting_items)._M_elems[0x1e] = '\0';
  (this->_starting_items)._M_elems[0x1f] = '\0';
  (this->_starting_items)._M_elems[0] = '\0';
  (this->_starting_items)._M_elems[1] = '\0';
  (this->_starting_items)._M_elems[2] = '\0';
  (this->_starting_items)._M_elems[3] = '\0';
  (this->_starting_items)._M_elems[4] = '\0';
  (this->_starting_items)._M_elems[5] = '\0';
  (this->_starting_items)._M_elems[6] = '\0';
  (this->_starting_items)._M_elems[7] = '\0';
  (this->_starting_items)._M_elems[8] = '\0';
  (this->_starting_items)._M_elems[9] = '\0';
  (this->_starting_items)._M_elems[10] = '\0';
  (this->_starting_items)._M_elems[0xb] = '\0';
  (this->_starting_items)._M_elems[0xc] = '\0';
  (this->_starting_items)._M_elems[0xd] = '\0';
  (this->_starting_items)._M_elems[0xe] = '\0';
  (this->_starting_items)._M_elems[0xf] = '\0';
  (this->_items_distribution)._M_elems[0x30] = '\0';
  (this->_items_distribution)._M_elems[0x31] = '\0';
  (this->_items_distribution)._M_elems[0x32] = '\0';
  (this->_items_distribution)._M_elems[0x33] = '\0';
  (this->_items_distribution)._M_elems[0x34] = '\0';
  (this->_items_distribution)._M_elems[0x35] = '\0';
  (this->_items_distribution)._M_elems[0x36] = '\0';
  (this->_items_distribution)._M_elems[0x37] = '\0';
  (this->_items_distribution)._M_elems[0x38] = '\0';
  (this->_items_distribution)._M_elems[0x39] = '\0';
  (this->_items_distribution)._M_elems[0x3a] = '\0';
  (this->_items_distribution)._M_elems[0x3b] = '\0';
  (this->_items_distribution)._M_elems[0x3c] = '\0';
  (this->_items_distribution)._M_elems[0x3d] = '\0';
  (this->_items_distribution)._M_elems[0x3e] = '\0';
  (this->_items_distribution)._M_elems[0x3f] = '\0';
  (this->_items_distribution)._M_elems[0x20] = '\0';
  (this->_items_distribution)._M_elems[0x21] = '\0';
  (this->_items_distribution)._M_elems[0x22] = '\0';
  (this->_items_distribution)._M_elems[0x23] = '\0';
  (this->_items_distribution)._M_elems[0x24] = '\0';
  (this->_items_distribution)._M_elems[0x25] = '\0';
  (this->_items_distribution)._M_elems[0x26] = '\0';
  (this->_items_distribution)._M_elems[0x27] = '\0';
  (this->_items_distribution)._M_elems[0x28] = '\0';
  (this->_items_distribution)._M_elems[0x29] = '\0';
  (this->_items_distribution)._M_elems[0x2a] = '\0';
  (this->_items_distribution)._M_elems[0x2b] = '\0';
  (this->_items_distribution)._M_elems[0x2c] = '\0';
  (this->_items_distribution)._M_elems[0x2d] = '\0';
  (this->_items_distribution)._M_elems[0x2e] = '\0';
  (this->_items_distribution)._M_elems[0x2f] = '\0';
  (this->_items_distribution)._M_elems[0x10] = '\0';
  (this->_items_distribution)._M_elems[0x11] = '\0';
  (this->_items_distribution)._M_elems[0x12] = '\0';
  (this->_items_distribution)._M_elems[0x13] = '\0';
  (this->_items_distribution)._M_elems[0x14] = '\0';
  (this->_items_distribution)._M_elems[0x15] = '\0';
  (this->_items_distribution)._M_elems[0x16] = '\0';
  (this->_items_distribution)._M_elems[0x17] = '\0';
  (this->_items_distribution)._M_elems[0x18] = '\0';
  (this->_items_distribution)._M_elems[0x19] = '\0';
  (this->_items_distribution)._M_elems[0x1a] = '\0';
  (this->_items_distribution)._M_elems[0x1b] = '\0';
  (this->_items_distribution)._M_elems[0x1c] = '\0';
  (this->_items_distribution)._M_elems[0x1d] = '\0';
  (this->_items_distribution)._M_elems[0x1e] = '\0';
  (this->_items_distribution)._M_elems[0x1f] = '\0';
  (this->_items_distribution)._M_elems[0] = '\0';
  (this->_items_distribution)._M_elems[1] = '\0';
  (this->_items_distribution)._M_elems[2] = '\0';
  (this->_items_distribution)._M_elems[3] = '\0';
  (this->_items_distribution)._M_elems[4] = '\0';
  (this->_items_distribution)._M_elems[5] = '\0';
  (this->_items_distribution)._M_elems[6] = '\0';
  (this->_items_distribution)._M_elems[7] = '\0';
  (this->_items_distribution)._M_elems[8] = '\0';
  (this->_items_distribution)._M_elems[9] = '\0';
  (this->_items_distribution)._M_elems[10] = '\0';
  (this->_items_distribution)._M_elems[0xb] = '\0';
  (this->_items_distribution)._M_elems[0xc] = '\0';
  (this->_items_distribution)._M_elems[0xd] = '\0';
  (this->_items_distribution)._M_elems[0xe] = '\0';
  (this->_items_distribution)._M_elems[0xf] = '\0';
  (this->_items_distribution)._M_elems[0x3d] = '\0';
  (this->_items_distribution)._M_elems[0x3e] = '\0';
  (this->_items_distribution)._M_elems[0x3f] = '\0';
  (this->_items_distribution)._M_elems[0x40] = '\0';
  (this->_items_distribution)._M_elems[0x41] = '\0';
  (this->_items_distribution)._M_elems[0x42] = '\0';
  (this->_items_distribution)._M_elems[0x43] = '\0';
  (this->_items_distribution)._M_elems[0x44] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&preset_file,"permalink",(allocator<char> *)&preset_json);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&preset_path,"",(allocator<char> *)&local_298);
  ArgumentDictionary::get_string(&permalink_string,args,(string *)&preset_file,&preset_path);
  std::__cxx11::string::~string((string *)&preset_path);
  std::__cxx11::string::~string((string *)&preset_file);
  if (permalink_string._M_string_length == 0) {
    uVar3 = std::chrono::_V2::system_clock::now();
    this->_seed = uVar3;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&preset_file,"preset",(allocator<char> *)&local_298);
    std::__cxx11::string::string<std::allocator<char>>((string *)&preset_json,"",&local_2f1);
    ArgumentDictionary::get_string(&preset_path,args,(string *)&preset_file,(string *)&preset_json);
    std::__cxx11::string::~string((string *)&preset_json);
    std::__cxx11::string::~string((string *)&preset_file);
    stringtools::trim(&preset_path);
    if (preset_path._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&preset_file,"stdin",(allocator<char> *)&preset_json);
      bVar2 = ArgumentDictionary::get_boolean(args,(string *)&preset_file,true);
      std::__cxx11::string::~string((string *)&preset_file);
      if (bVar2) {
        std::operator<<((ostream *)&std::cout,
                        "Please specify a preset name (name of a file inside the \'presets\' folder, leave empty for default): "
                       );
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&std::cin,(string *)&preset_path);
        stringtools::trim(&preset_path);
      }
      if (preset_path._M_string_length == 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  (&preset_path,"default");
      }
    }
    sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (&preset_path,'/',0);
    if (sVar4 == 0xffffffffffffffff) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &preset_file,"./presets/",&preset_path);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&preset_path,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&preset_file);
      std::__cxx11::string::~string((string *)&preset_file);
    }
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            ends_with(&preset_path,".json");
    if (!bVar2) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&preset_path,".json");
    }
    std::ifstream::ifstream(&preset_file,(string *)&preset_path,_S_in);
    if ((abStack_218[*(long *)(_preset_file + -0x18)] & 5) != 0) {
      this_00 = (LandstalkerException *)__cxa_allocate_exception(0x28);
      std::operator+(&local_298,"Could not open preset file at given path \'",&preset_path);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &preset_json,&local_298,"\'");
      LandstalkerException::LandstalkerException(this_00,(string *)&preset_json);
      __cxa_throw(this_00,&LandstalkerException::typeinfo,
                  LandstalkerException::~LandstalkerException);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&preset_json,"silent",(allocator<char> *)&local_298);
    bVar2 = ArgumentDictionary::get_boolean(args,(string *)&preset_json,false);
    std::__cxx11::string::~string((string *)&preset_json);
    if (!bVar2) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Preset: \'");
      poVar5 = std::operator<<(poVar5,(string *)&preset_path);
      std::operator<<(poVar5,"\'\n");
    }
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json(&preset_json,(nullptr_t)0x0);
    nlohmann::operator>>((istream *)&preset_file,&preset_json);
    parse_json(this,&preset_json);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&preset_json);
    std::ifstream::~ifstream(&preset_file);
    this_01 = &preset_path;
  }
  else {
    std::__cxx11::string::string((string *)&local_258,&permalink_string);
    parse_permalink(this,&local_258);
    this_01 = &local_258;
  }
  std::__cxx11::string::~string((string *)this_01);
  validate(this);
  std::__cxx11::string::~string((string *)&permalink_string);
  return;
}

Assistant:

RandomizerOptions::RandomizerOptions(const ArgumentDictionary& args,
                                     const std::map<std::string, uint8_t>& item_names,
                                     const std::vector<std::string>& spawn_location_names)
{
    _item_names = item_names;
    _spawn_location_names = spawn_location_names;
    _starting_items.fill(0);
    _items_distribution.fill(0);

    std::string permalink_string = args.get_string("permalink");
    if(!permalink_string.empty())
    {
        // Permalink case: unpack it to find the preset and seed and generate the same world
        this->parse_permalink(permalink_string);
    }
    else
    {
        // Regular case: pick a random seed, read a preset file to get the config and generate a new world
        _seed = (uint32_t) std::chrono::system_clock::now().time_since_epoch().count();

        std::string preset_path = args.get_string("preset");
        stringtools::trim(preset_path);
        if(preset_path.empty())
        {
            if(args.get_boolean("stdin", true))
            {
                std::cout << "Please specify a preset name (name of a file inside the 'presets' folder, leave empty for default): ";
                std::getline(std::cin, preset_path);
                stringtools::trim(preset_path);
            }

            if(preset_path.empty())
                preset_path = "default";
        }

        // If a path was given, filter any kind of directories only keeping the last part of the path
        if(preset_path.find('/') == std::string::npos)
            preset_path = "./presets/" + preset_path;

        if(!preset_path.ends_with(".json"))
            preset_path += ".json";

        std::ifstream preset_file(preset_path);
        if(!preset_file)
            throw LandstalkerException("Could not open preset file at given path '" + preset_path + "'");

        if(!args.get_boolean("silent", false))
            std::cout << "Preset: '" << preset_path << "'\n";

        Json preset_json;
        preset_file >> preset_json;
        this->parse_json(preset_json);
    }

    this->validate();
}